

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QVariant>::reallocateAndGrow
          (QArrayDataPointer<QVariant> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QVariant> *old)

{
  undefined8 *puVar1;
  Data *pDVar2;
  undefined1 *puVar3;
  PrivateShared *pPVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  QVariant *pQVar7;
  QVariant *data;
  long lVar8;
  QVariant *pQVar9;
  QVariant *pQVar10;
  long in_FS_OFFSET;
  QArrayDataPointer<QVariant> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QVariant> *)0x0 && where == GrowsAtEnd) &&
       (pDVar2 = this->d, pDVar2 != (Data *)0x0)) && (0 < n)) &&
     ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QtPrivate::QMovableArrayOps<QVariant>::reallocate
                ((QMovableArrayOps<QVariant> *)this,
                 n + this->size +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
                        ) >> 5),Grow);
      return;
    }
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_48,this,n,where);
    pQVar7 = local_48.ptr;
    if (local_48.ptr == (QVariant *)0x0 && 0 < n) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        qBadAlloc();
      }
    }
    else {
      if (this->size != 0) {
        lVar8 = this->size + (n >> 0x3f & n);
        if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<QVariant> *)0x0)) ||
           (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          if (0 < lVar8) {
            pQVar10 = this->ptr;
            pQVar9 = pQVar10 + lVar8;
            do {
              QVariant::QVariant(pQVar7 + local_48.size,pQVar10);
              pQVar10 = pQVar10 + 1;
              local_48.size = local_48.size + 1;
            } while (pQVar10 < pQVar9);
          }
        }
        else if (0 < lVar8) {
          pQVar7 = this->ptr;
          pQVar10 = pQVar7 + lVar8;
          do {
            pPVar4 = (pQVar7->d).data.shared;
            uVar5 = *(undefined8 *)((long)&(pQVar7->d).data + 8);
            uVar6 = *(undefined8 *)&(pQVar7->d).field_0x18;
            puVar1 = (undefined8 *)((long)&local_48.ptr[local_48.size].d.data + 0x10);
            *puVar1 = *(undefined8 *)((long)&(pQVar7->d).data + 0x10);
            puVar1[1] = uVar6;
            local_48.ptr[local_48.size].d.data.shared = pPVar4;
            *(undefined8 *)((long)&local_48.ptr[local_48.size].d.data + 8) = uVar5;
            (pQVar7->d).data.shared = (PrivateShared *)0x0;
            *(undefined8 *)((long)&(pQVar7->d).data + 8) = 0;
            *(undefined8 *)((long)&(pQVar7->d).data + 0x10) = 0;
            *(undefined8 *)&(pQVar7->d).field_0x18 = 2;
            pQVar7 = pQVar7 + 1;
            local_48.size = local_48.size + 1;
          } while (pQVar7 < pQVar10);
        }
      }
      pDVar2 = this->d;
      pQVar7 = this->ptr;
      this->d = local_48.d;
      this->ptr = local_48.ptr;
      puVar3 = (undefined1 *)this->size;
      this->size = local_48.size;
      local_48.d = pDVar2;
      local_48.ptr = pQVar7;
      local_48.size = (qsizetype)puVar3;
      if (old != (QArrayDataPointer<QVariant> *)0x0) {
        local_48.d = old->d;
        local_48.ptr = old->ptr;
        old->d = pDVar2;
        old->ptr = pQVar7;
        local_48.size = old->size;
        old->size = (qsizetype)puVar3;
      }
      ~QArrayDataPointer(&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }